

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int GetLatestAliveMsgSeanet(SEANET *pSeanet)

{
  int iVar1;
  int local_2c;
  uchar databuf [22];
  
  databuf[0] = '\0';
  databuf[1] = '\0';
  databuf[2] = '\0';
  databuf[3] = '\0';
  databuf[4] = '\0';
  databuf[5] = '\0';
  databuf[6] = '\0';
  databuf[7] = '\0';
  databuf[8] = '\0';
  databuf[9] = '\0';
  databuf[10] = '\0';
  databuf[0xb] = '\0';
  databuf[0xc] = '\0';
  databuf[0xd] = '\0';
  databuf[0xe] = '\0';
  databuf[0xf] = '\0';
  databuf[0x10] = '\0';
  databuf[0x11] = '\0';
  databuf[0x12] = '\0';
  databuf[0x13] = '\0';
  databuf[0x14] = '\0';
  databuf[0x15] = '\0';
  local_2c = 0;
  iVar1 = GetLatestMsgSeanet(pSeanet,4,databuf,0x16,&local_2c);
  if (iVar1 == 0) {
    pSeanet->HeadInf = (uint)databuf[0x14];
  }
  else {
    puts("A Seanet is not responding correctly. ");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int GetLatestAliveMsgSeanet(SEANET* pSeanet)
{
	unsigned char databuf[22];
	int nbdatabytes = 0;

	// Wait for a mtAlive message. It should come every 1 second.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// HeadInf.
	pSeanet->HeadInf = (unsigned char)databuf[20];

	return EXIT_SUCCESS;
}